

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

Maybe<capnp::ClientHook_&> __thiscall capnp::MembraneHook::getResolved(MembraneHook *this)

{
  undefined8 uVar1;
  long in_RSI;
  Own<capnp::ClientHook,_std::nullptr_t> newResolved;
  undefined1 local_40 [32];
  
  if (*(_func_int ***)(in_RSI + 0x50) == (_func_int **)0x0) {
    (**(code **)(**(long **)(in_RSI + 0x28) + 0x10))(local_40);
    if ((ClientHook *)local_40._0_8_ == (ClientHook *)0x0) {
      (this->super_ClientHook)._vptr_ClientHook = (_func_int **)0x0;
    }
    else {
      wrap((MembraneHook *)local_40,(ClientHook *)local_40._0_8_,*(MembranePolicy **)(in_RSI + 0x38)
           ,*(bool *)(in_RSI + 0x40));
      uVar1 = local_40._8_8_;
      local_40._16_8_ = local_40._0_8_;
      local_40._24_8_ = local_40._8_8_;
      local_40._8_8_ = (ClientHook *)0x0;
      kj::Own<capnp::ClientHook,_std::nullptr_t>::operator=
                ((Own<capnp::ClientHook,_std::nullptr_t> *)(in_RSI + 0x48),
                 (Own<capnp::ClientHook,_std::nullptr_t> *)(local_40 + 0x10));
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_40 + 0x10));
      (this->super_ClientHook)._vptr_ClientHook = (_func_int **)uVar1;
      kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                ((Own<capnp::ClientHook,_std::nullptr_t> *)local_40);
    }
  }
  else {
    (this->super_ClientHook)._vptr_ClientHook = *(_func_int ***)(in_RSI + 0x50);
  }
  return (Maybe<capnp::ClientHook_&>)&this->super_ClientHook;
}

Assistant:

kj::Maybe<ClientHook&> getResolved() override {
    KJ_IF_SOME(r, resolved) {
      return *r;
    }

    KJ_IF_SOME(newInner, inner->getResolved()) {
      kj::Own<ClientHook> newResolved = wrap(newInner, *policy, reverse);
      ClientHook& result = *newResolved;
      resolved = kj::mv(newResolved);
      return result;
    } else {
      return kj::none;
    }
  }